

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O1

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  int ki;
  int iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int kj;
  int iVar25;
  int iVar26;
  ulong uVar27;
  void *pvVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  void *pvVar37;
  int iVar38;
  ulong uVar39;
  int l;
  int iVar40;
  ulong uVar41;
  bool bVar42;
  float fVar43;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  void *local_210;
  int local_204;
  void *local_200;
  int local_1f0;
  int local_1ec;
  ulong local_1c8;
  ulong local_1a0;
  void *local_198;
  void *local_188;
  allocator_type local_179;
  ulong local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long local_158;
  ulong local_150;
  Mat local_148;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  long local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  uVar30 = bottom_blob->w;
  iVar21 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  uVar10 = bottom_blob->c;
  uVar23 = (ulong)uVar10;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_148.cstep = 0;
      local_148.data = (void *)0x0;
      local_148.refcount._0_4_ = 0;
      local_148.refcount._4_4_ = 0;
      local_148.elemsize._0_4_ = 0;
      local_148.elemsize._4_4_ = 0;
      local_148.elempack = 0;
      local_148.allocator = (Allocator *)0x0;
      local_148.dims = 0;
      local_148.w = 0;
      local_148.h = 0;
      local_148.d = 0;
      local_148.c = 0;
      local_78.lightmode = opt->lightmode;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_ops = opt->use_subgroup_ops;
      local_78.use_reserved_0 = opt->use_reserved_0;
      local_78.num_threads = opt->num_threads;
      local_78.blob_allocator = opt->blob_allocator;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      uVar24._0_1_ = opt->use_bf16_storage;
      uVar24._1_1_ = opt->use_fp16_packed;
      uVar24._2_1_ = opt->use_fp16_storage;
      uVar24._3_1_ = opt->use_fp16_arithmetic;
      uVar24._4_1_ = opt->use_int8_packed;
      uVar24._5_1_ = opt->use_int8_storage;
      uVar24._6_1_ = opt->use_int8_arithmetic;
      uVar24._7_1_ = opt->use_packing_layout;
      local_78.vulkan_device_index = opt->vulkan_device_index;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_shader_local_memory = opt->use_shader_local_memory;
      local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
      local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
      local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
      local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
      local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      local_78.use_fp16_uniform = opt->use_fp16_uniform;
      local_78.use_int8_uniform = opt->use_int8_uniform;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78._32_8_ = uVar24 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_148,&local_78);
      iVar3 = local_148.d;
      iVar2 = local_148.h;
      iVar21 = local_148.w;
      iVar22 = -100;
      if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
        iVar19 = (local_148.w - this->kernel_w) / this->stride_w;
        uVar24 = (long)(local_148.h - this->kernel_h) / (long)this->stride_h;
        local_f0 = uVar24 & 0xffffffff;
        uVar20 = iVar19 + 1;
        uVar14 = (int)uVar24 + 1;
        uVar27 = (ulong)uVar14;
        uVar24 = (long)(local_148.d - this->kernel_d) / (long)this->stride_d;
        local_178 = uVar24 & 0xffffffff;
        uVar30 = (int)uVar24 + 1;
        local_b8 = (ulong)uVar30;
        Mat::create(top_blob,uVar20,uVar14,uVar30,uVar10,sVar4,(Allocator *)0x0);
        iVar22 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar24 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_90,uVar24,&local_179);
          if (0 < this->kernel_d) {
            iVar22 = this->kernel_w;
            iVar9 = this->kernel_h;
            iVar31 = 0;
            iVar26 = 0;
            iVar25 = 0;
            do {
              if (0 < this->kernel_h) {
                iVar11 = 0;
                do {
                  if (0 < this->kernel_w) {
                    lVar16 = 0;
                    do {
                      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar25 + lVar16] = iVar26 + (int)lVar16;
                      lVar16 = lVar16 + 1;
                      iVar29 = (int)lVar16;
                    } while (iVar29 < this->kernel_w);
                    iVar25 = iVar25 + iVar29;
                    iVar26 = iVar26 + iVar29;
                  }
                  iVar26 = iVar26 + (iVar21 - iVar22);
                  iVar11 = iVar11 + 1;
                } while (iVar11 < this->kernel_h);
              }
              iVar26 = iVar26 + (iVar2 - iVar9) * iVar21;
              iVar31 = iVar31 + 1;
            } while (iVar31 < this->kernel_d);
          }
          iVar22 = (int)uVar24;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              local_204 = 0;
              local_1ec = 0;
              local_1f0 = 0;
              if (this->pad_mode == 0) {
                local_204 = (bottom_blob->w - local_148.w) + this->pad_left + this->pad_right;
                local_1ec = (bottom_blob->h - local_148.h) + this->pad_top + this->pad_bottom;
                local_1f0 = (bottom_blob->d - local_148.d) + this->pad_front + this->pad_behind;
              }
              if (0 < (int)uVar10) {
                local_e8 = local_148.data;
                local_d8 = top_blob->data;
                local_e0 = top_blob->cstep * top_blob->elemsize;
                local_c8 = (long)this->stride_d;
                local_98 = (long)(int)uVar20;
                local_168 = (ulong)uVar20;
                local_d0 = local_148.cstep *
                           CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                lVar16 = (long)local_148.w *
                         CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                local_c0 = local_148.h * lVar16 * local_c8;
                local_f8 = 0;
                do {
                  if (-1 < (int)local_178) {
                    local_188 = (void *)(local_e0 * local_f8 + (long)local_d8);
                    local_a0 = (long)this->stride_h;
                    local_170 = lVar16 * local_a0;
                    pvVar12 = local_e8;
                    uVar24 = 0;
                    do {
                      local_b0 = uVar24;
                      local_a8 = pvVar12;
                      if (-1 < (int)local_f0) {
                        local_158 = (long)this->stride_w;
                        uVar30 = this->kernel_d;
                        local_160 = local_158 * 4;
                        local_1a0 = 0;
                        local_198 = local_a8;
                        do {
                          if (-1 < iVar19) {
                            iVar22 = this->pad_front;
                            lVar33 = 0;
                            uVar24 = 0;
                            pvVar12 = local_198;
                            do {
                              fVar43 = NAN;
                              if (0 < (int)uVar30) {
                                lVar18 = (long)((local_1ec + iVar2) - this->pad_bottom);
                                lVar17 = (long)((local_1f0 + iVar3) - this->pad_behind);
                                fVar43 = 0.0;
                                uVar39 = 0;
                                iVar9 = 0;
                                pvVar37 = pvVar12;
                                do {
                                  lVar13 = local_b0 * local_c8 + uVar39;
                                  iVar31 = 0x5e;
                                  if (iVar22 <= lVar13) {
                                    iVar31 = 0;
                                    if (lVar17 <= lVar13) {
                                      iVar31 = 0x5c;
                                    }
                                    if (lVar13 < lVar17 && 0 < this->kernel_h) {
                                      uVar15 = 0;
                                      pvVar28 = pvVar37;
                                      do {
                                        lVar13 = uVar15 + local_1a0 * local_a0;
                                        iVar26 = 0x61;
                                        if (this->pad_top <= lVar13) {
                                          iVar26 = 0;
                                          if (lVar18 <= lVar13) {
                                            iVar26 = 0x5f;
                                          }
                                          if (lVar13 < lVar18 && 0 < this->kernel_w) {
                                            uVar41 = 0;
                                            do {
                                              iVar31 = 100;
                                              if (((long)this->pad_left <= (long)(lVar33 + uVar41))
                                                 && (iVar31 = 0x62,
                                                    (long)(lVar33 + uVar41) <
                                                    (long)((local_204 + iVar21) - this->pad_right)))
                                              {
                                                fVar43 = fVar43 + *(float *)((long)pvVar28 +
                                                                            uVar41 * 4);
                                                iVar9 = iVar9 + 1;
                                                iVar31 = 0;
                                              }
                                            } while (((iVar31 == 100) || (iVar26 = 0, iVar31 == 0))
                                                    && (uVar41 = uVar41 + 1, iVar26 = 0,
                                                       (uint)this->kernel_w != uVar41));
                                          }
                                        }
                                        iVar31 = 0;
                                        if ((iVar26 != 0x61) && (iVar26 != 0)) break;
                                        uVar15 = uVar15 + 1;
                                        pvVar28 = (void *)((long)pvVar28 + lVar16);
                                      } while (uVar15 != (uint)this->kernel_h);
                                    }
                                  }
                                  if ((iVar31 != 0x5e) && (iVar31 != 0)) break;
                                  uVar39 = uVar39 + 1;
                                  pvVar37 = (void *)((long)pvVar37 + local_148.h * lVar16);
                                } while (uVar39 != uVar30);
                                fVar43 = fVar43 / (float)iVar9;
                                local_150 = uVar24;
                              }
                              *(float *)((long)local_188 + uVar24 * 4) = fVar43;
                              uVar24 = uVar24 + 1;
                              pvVar12 = (void *)((long)pvVar12 + local_160);
                              lVar33 = lVar33 + local_158;
                            } while (uVar24 != local_168);
                          }
                          local_188 = (void *)((long)local_188 + local_98 * 4);
                          local_1a0 = local_1a0 + 1;
                          local_198 = (void *)((long)local_198 + local_170);
                        } while (local_1a0 != uVar27);
                      }
                      pvVar12 = (void *)((long)local_a8 + local_c0);
                      uVar24 = local_b0 + 1;
                    } while (local_b0 + 1 != local_b8);
                  }
                  local_f8 = local_f8 + 1;
                  local_e8 = (void *)((long)local_e8 + local_d0);
                } while (local_f8 != uVar23);
              }
            }
            else if (0 < (int)uVar10) {
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              pvVar12 = top_blob->data;
              lVar16 = (long)local_148.w *
                       CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
              local_200 = (void *)0x0;
              do {
                if (-1 < (int)local_178) {
                  pvVar37 = (void *)(sVar4 * sVar5 * (long)local_200 + (long)pvVar12);
                  iVar21 = 0;
                  do {
                    if (-1 < (int)local_f0) {
                      iVar2 = this->stride_d;
                      iVar3 = this->stride_h;
                      iVar9 = this->stride_w;
                      uVar39 = 0;
                      do {
                        if (-1 < iVar19) {
                          uVar15 = 0;
                          do {
                            if (iVar22 < 1) {
                              fVar43 = 0.0;
                            }
                            else {
                              fVar43 = 0.0;
                              uVar41 = 0;
                              do {
                                fVar43 = fVar43 + *(float *)((long)local_148.data +
                                                            (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar41] *
                                                  4 + uVar15 * (long)iVar9 * 4 +
                                                      uVar39 * iVar3 * lVar16 +
                                                      (long)iVar21 * (long)iVar2 *
                                                      local_148.h * lVar16 +
                                                      local_148.cstep *
                                                      CONCAT44(local_148.elemsize._4_4_,
                                                               (undefined4)local_148.elemsize) *
                                                      (long)local_200);
                                uVar41 = uVar41 + 1;
                              } while ((uVar24 & 0xffffffff) != uVar41);
                            }
                            *(float *)((long)pvVar37 + uVar15 * 4) = fVar43 * (1.0 / (float)iVar22);
                            uVar15 = uVar15 + 1;
                          } while (uVar15 != uVar20);
                        }
                        pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar20 * 4);
                        uVar39 = uVar39 + 1;
                      } while (uVar39 != uVar27);
                    }
                    bVar42 = iVar21 != (int)local_178;
                    iVar21 = iVar21 + 1;
                  } while (bVar42);
                }
                local_200 = (void *)((long)local_200 + 1);
              } while (local_200 != (void *)uVar23);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar10)) {
            pvVar12 = top_blob->data;
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            lVar16 = (long)local_148.w *
                     CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
            local_200 = (void *)0x0;
            do {
              if (-1 < (int)local_178) {
                pvVar37 = (void *)(sVar4 * sVar5 * (long)local_200 + (long)pvVar12);
                iVar21 = 0;
                do {
                  if (-1 < (int)local_f0) {
                    iVar2 = this->stride_d;
                    iVar3 = this->stride_h;
                    iVar9 = this->stride_w;
                    uVar39 = 0;
                    do {
                      if (-1 < iVar19) {
                        lVar33 = uVar39 * iVar3 * lVar16 +
                                 (long)iVar21 * (long)iVar2 * local_148.h * lVar16 +
                                 local_148.cstep *
                                 CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                                 (long)local_200;
                        uVar15 = 0;
                        do {
                          lVar17 = uVar15 * (long)iVar9;
                          fVar43 = *(float *)((long)local_148.data + lVar17 * 4 + lVar33);
                          if (0 < iVar22) {
                            uVar41 = 0;
                            do {
                              fVar1 = *(float *)((long)local_148.data +
                                                (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar41] *
                                                4 + lVar17 * 4 + lVar33);
                              if (fVar43 <= fVar1) {
                                fVar43 = fVar1;
                              }
                              uVar41 = uVar41 + 1;
                            } while ((uVar24 & 0xffffffff) != uVar41);
                          }
                          *(float *)((long)pvVar37 + uVar15 * 4) = fVar43;
                          uVar15 = uVar15 + 1;
                        } while (uVar15 != uVar20);
                      }
                      pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar20 * 4);
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != uVar27);
                  }
                  bVar42 = iVar21 != (int)local_178;
                  iVar21 = iVar21 + 1;
                } while (bVar42);
              }
              local_200 = (void *)((long)local_200 + 1);
            } while (local_200 != (void *)uVar23);
          }
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar22 = 0;
        }
      }
      piVar6 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            if (local_148.data != (void *)0x0) {
              free(local_148.data);
            }
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uVar20 = this->out_w;
      if (this->out_w == 0xffffff17) {
        uVar20 = uVar30;
      }
      iVar3 = this->out_h;
      if (this->out_h == -0xe9) {
        iVar3 = iVar21;
      }
      iVar19 = this->out_d;
      if (this->out_d == -0xe9) {
        iVar19 = iVar2;
      }
      if (iVar19 == iVar2 && (iVar3 == iVar21 && uVar20 == uVar30)) {
        iVar22 = 0;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar22 = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar21 = bottom_blob->w;
          iVar2 = bottom_blob->h;
          iVar3 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar21;
          top_blob->h = iVar2;
          top_blob->d = iVar3;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
      }
      else {
        Mat::create(top_blob,uVar20,iVar3,iVar19,uVar10,sVar4,opt->blob_allocator);
        iVar22 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar22 = 0;
          if (this->pooling_type == 0) {
            if (0 < (int)uVar10) {
              pvVar12 = bottom_blob->data;
              sVar4 = bottom_blob->cstep;
              sVar5 = bottom_blob->elemsize;
              pvVar37 = top_blob->data;
              sVar7 = top_blob->cstep;
              sVar8 = top_blob->elemsize;
              local_1c8 = 0;
              do {
                if (0 < iVar19) {
                  lVar16 = sVar4 * sVar5 * local_1c8;
                  local_210 = (void *)(sVar7 * sVar8 * local_1c8 + (long)pvVar37);
                  iVar22 = 0;
                  do {
                    uVar24 = (long)(iVar22 * iVar2) / (long)iVar19;
                    iVar22 = iVar22 + 1;
                    uVar10 = (iVar22 * iVar2 + iVar19 + -1) / iVar19;
                    if (0 < iVar3) {
                      iVar31 = (int)uVar24;
                      iVar9 = 0;
                      do {
                        uVar27 = (long)(iVar9 * iVar21) / (long)iVar3;
                        iVar9 = iVar9 + 1;
                        uVar14 = (iVar9 * iVar21 + iVar3 + -1) / iVar3;
                        if (0 < (int)uVar20) {
                          iVar26 = (int)uVar27;
                          uVar39 = 0;
                          do {
                            uVar41 = uVar24 & 0xffffffff;
                            iVar25 = (int)(uVar30 * (int)uVar39) / (int)uVar20;
                            uVar15 = uVar39 + 1;
                            iVar11 = (int)((int)uVar15 * uVar30 + (uVar20 - 1)) / (int)uVar20;
                            iVar29 = iVar25 + (iVar31 * iVar21 + iVar26) * uVar30;
                            fVar43 = *(float *)((long)pvVar12 + (long)iVar29 * 4 + lVar16);
                            if (iVar31 < (int)uVar10) {
                              do {
                                uVar36 = uVar27 & 0xffffffff;
                                iVar40 = iVar29;
                                if (iVar26 < (int)uVar14) {
                                  do {
                                    lVar33 = (long)iVar11 - (long)iVar25;
                                    iVar38 = iVar40;
                                    if (iVar25 < iVar11) {
                                      do {
                                        fVar1 = *(float *)((long)pvVar12 + (long)iVar38 * 4 + lVar16
                                                          );
                                        if (fVar43 <= fVar1) {
                                          fVar43 = fVar1;
                                        }
                                        iVar38 = iVar38 + 1;
                                        lVar33 = lVar33 + -1;
                                      } while (lVar33 != 0);
                                    }
                                    uVar35 = (int)uVar36 + 1;
                                    uVar36 = (ulong)uVar35;
                                    iVar40 = iVar40 + uVar30;
                                  } while (uVar35 != uVar14);
                                }
                                uVar35 = (int)uVar41 + 1;
                                uVar41 = (ulong)uVar35;
                                iVar29 = iVar29 + iVar21 * uVar30;
                              } while (uVar35 != uVar10);
                            }
                            *(float *)((long)local_210 + uVar39 * 4) = fVar43;
                            uVar39 = uVar15;
                          } while (uVar15 != uVar20);
                        }
                        local_210 = (void *)((long)local_210 + (long)(int)uVar20 * 4);
                      } while (iVar9 != iVar3);
                    }
                  } while (iVar22 != iVar19);
                }
                local_1c8 = local_1c8 + 1;
                iVar22 = 0;
              } while (local_1c8 != uVar23);
            }
          }
          else if ((this->pooling_type == 1) && (0 < (int)uVar10)) {
            pvVar12 = bottom_blob->data;
            sVar4 = bottom_blob->cstep;
            sVar5 = bottom_blob->elemsize;
            pvVar37 = top_blob->data;
            sVar7 = top_blob->cstep;
            sVar8 = top_blob->elemsize;
            local_1c8 = 0;
            do {
              if (0 < iVar19) {
                local_200 = (void *)(sVar7 * sVar8 * local_1c8 + (long)pvVar37);
                iVar22 = 0;
                do {
                  iVar31 = (iVar22 * iVar2) / iVar19;
                  iVar22 = iVar22 + 1;
                  iVar9 = (iVar22 * iVar2 + iVar19 + -1) / iVar19;
                  if (0 < iVar3) {
                    iVar26 = 0;
                    do {
                      uVar24 = (long)(iVar26 * iVar21) / (long)iVar3;
                      iVar26 = iVar26 + 1;
                      uVar10 = (iVar26 * iVar21 + iVar3 + -1) / iVar3;
                      if (0 < (int)uVar20) {
                        iVar25 = (int)uVar24;
                        uVar27 = 0;
                        do {
                          iVar29 = (int)(uVar30 * (int)uVar27) / (int)uVar20;
                          uVar39 = uVar27 + 1;
                          iVar11 = (int)((int)uVar39 * uVar30 + (uVar20 - 1)) / (int)uVar20;
                          fVar43 = 0.0;
                          if (iVar31 < iVar9) {
                            iVar38 = (iVar21 * iVar31 + iVar25) * uVar30 + iVar29;
                            iVar40 = iVar31;
                            do {
                              uVar15 = uVar24 & 0xffffffff;
                              iVar34 = iVar38;
                              if (iVar25 < (int)uVar10) {
                                do {
                                  lVar16 = (long)iVar11 - (long)iVar29;
                                  iVar32 = iVar34;
                                  if (iVar29 < iVar11) {
                                    do {
                                      fVar43 = fVar43 + *(float *)((long)pvVar12 +
                                                                  (long)iVar32 * 4 +
                                                                  sVar4 * sVar5 * local_1c8);
                                      iVar32 = iVar32 + 1;
                                      lVar16 = lVar16 + -1;
                                    } while (lVar16 != 0);
                                  }
                                  uVar14 = (int)uVar15 + 1;
                                  uVar15 = (ulong)uVar14;
                                  iVar34 = iVar34 + uVar30;
                                } while (uVar14 != uVar10);
                              }
                              iVar40 = iVar40 + 1;
                              iVar38 = iVar38 + iVar21 * uVar30;
                            } while (iVar40 != iVar9);
                          }
                          *(float *)((long)local_200 + uVar27 * 4) =
                               fVar43 / ((float)(iVar11 - iVar29) *
                                        (float)(int)(uVar10 - iVar25) * (float)(iVar9 - iVar31));
                          uVar27 = uVar39;
                        } while (uVar39 != uVar20);
                      }
                      local_200 = (void *)((long)local_200 + (long)(int)uVar20 * 4);
                    } while (iVar26 != iVar3);
                  }
                } while (iVar22 != iVar19);
              }
              local_1c8 = local_1c8 + 1;
              iVar22 = 0;
            } while (local_1c8 != uVar23);
          }
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar10,sVar4,opt->blob_allocator);
    iVar22 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar30 = iVar21 * uVar30 * iVar2;
      if (this->pooling_type == 0) {
        if ((int)uVar10 < 1) {
          return 0;
        }
        pvVar12 = bottom_blob->data;
        lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar37 = top_blob->data;
        uVar24 = 0;
        pvVar28 = pvVar12;
        do {
          fVar43 = *(float *)((long)pvVar12 + lVar16 * uVar24);
          if (0 < (int)uVar30) {
            uVar27 = 0;
            do {
              fVar1 = *(float *)((long)pvVar28 + uVar27 * 4);
              if (fVar43 <= fVar1) {
                fVar43 = fVar1;
              }
              uVar27 = uVar27 + 1;
            } while (uVar30 != uVar27);
          }
          *(float *)((long)pvVar37 + uVar24 * 4) = fVar43;
          uVar24 = uVar24 + 1;
          pvVar28 = (void *)((long)pvVar28 + lVar16);
        } while (uVar24 != uVar23);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar10 < 1) {
          return 0;
        }
        pvVar12 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        pvVar37 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        uVar24 = 0;
        do {
          fVar43 = 0.0;
          if (0 < (int)uVar30) {
            uVar27 = 0;
            do {
              fVar43 = fVar43 + *(float *)((long)pvVar12 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar30 != uVar27);
          }
          *(float *)((long)pvVar37 + uVar24 * 4) = fVar43 * (1.0 / (float)(int)uVar30);
          uVar24 = uVar24 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
        } while (uVar24 != uVar23);
      }
      iVar22 = 0;
    }
  }
  return iVar22;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;
        int _out_d = out_d == -233 ? d : out_d;

        if (_out_w == w && _out_h == h && _out_d == d)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, _out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}